

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

string * cpp_bindgen::wrap_line(string *__return_storage_ptr__,string *line,string *prefix)

{
  long lVar1;
  pointer pcVar2;
  runtime_error *this;
  pointer pcVar3;
  long lVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  string current_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string line_divider;
  long *local_a0;
  long local_98;
  long local_90 [2];
  string *local_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  local_58 = local_48;
  local_80 = line;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," &","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_a0 = local_90;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar5,pcVar5 + prefix->_M_string_length);
  pcVar5 = (local_80->_M_dataplus)._M_p;
  if (pcVar5 + (0x84 - local_98) < pcVar5 + local_80->_M_string_length) {
    pcVar2 = pcVar5;
    local_38 = prefix;
    do {
      pcVar3 = pcVar2;
      lVar6 = (-local_50 - local_98) + 0x84;
      lVar7 = local_50 + local_98 + -0x108;
      lVar4 = (-local_50 - local_98) + 0x83;
      while (pcVar3[lVar4] != ',') {
        lVar1 = lVar6 + -1;
        lVar6 = lVar6 + -1;
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + -1;
        if (pcVar3 + lVar1 == pcVar5 + 1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Too long line cannot be wrapped");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 (ulong)pcVar3);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_58,local_50 + (long)local_58);
      std::__cxx11::string::append((char *)local_78);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      pcVar5 = (local_38->_M_dataplus)._M_p;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar5,pcVar5 + local_38->_M_string_length);
      std::__cxx11::string::append((char *)local_78);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)local_78);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      pcVar5 = (local_80->_M_dataplus)._M_p;
      pcVar2 = pcVar3 + lVar6;
    } while (pcVar3 + (-lVar7 - local_98) < pcVar5 + local_80->_M_string_length);
    pcVar5 = pcVar3 + lVar6;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
  std::__cxx11::string::replace
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
             (ulong)pcVar5);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string wrap_line(const std::string &line, const std::string &prefix) {
        static constexpr unsigned int max_line_length = 132;
        const std::string line_divider = " &";
        std::string ret = "";
        std::string current_prefix = prefix;

        auto it = line.begin();
        while (it + max_line_length - current_prefix.size() < line.end()) {
            auto next_it = it + max_line_length - line_divider.size() - current_prefix.size();
            while (*(next_it - 1) != ',') {
                --next_it;
                if (next_it == line.begin() + 1)
                    throw std::runtime_error("Too long line cannot be wrapped");
            }

            ret.append(current_prefix);
            ret.append(it, next_it);
            ret.append(line_divider + "\n");

            it = next_it;
            // more indentation on next line
            current_prefix = prefix + "   ";
        }
        ret += current_prefix;
        ret.append(it, line.end());
        ret += '\n';
        return ret;
    }